

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standardize_data_array.h
# Opt level: O2

vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
* __thiscall
polyscope::
adaptorF_convertArrayOfVectorToStdVectorImpl<glm::vec<3,float,(glm::qualifier)0>,3u,std::vector<geometrycentral::Vector3,std::allocator<geometrycentral::Vector3>>,void>
          (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           *__return_storage_ptr__,polyscope *this)

{
  pointer pvVar1;
  size_type __n;
  long lVar2;
  size_t i;
  size_type sVar3;
  size_t j;
  long lVar4;
  pointer pvVar5;
  allocator_type local_19;
  
  __n = (*(long *)(this + 8) - *(long *)this) / 0x18;
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector(__return_storage_ptr__,__n,&local_19);
  lVar2 = *(long *)this;
  pvVar1 = (__return_storage_ptr__->
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  for (sVar3 = 0; sVar3 != __n; sVar3 = sVar3 + 1) {
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      pvVar5 = (pointer)&pvVar1[sVar3].field_2;
      if (((int)lVar4 != 2) && (pvVar5 = pvVar1 + sVar3, (int)lVar4 == 1)) {
        pvVar5 = (pointer)&pvVar1[sVar3].field_1;
      }
      (pvVar5->field_0).x = (float)*(double *)(lVar2 + lVar4 * 8);
    }
    lVar2 = lVar2 + 0x18;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<O> adaptorF_convertArrayOfVectorToStdVectorImpl(PreferenceT<6>, const T& inputData) {
  size_t dataSize = adaptorF_size(inputData);
  std::vector<O> dataOut(dataSize);
  for (size_t i = 0; i < dataSize; i++) {
    for (size_t j = 0; j < D; j++) {
      dataOut[i][j] = inputData[i][j];
    }
  }
  return dataOut;
}